

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::Search(ON_RTree *this,double tolerance,
                _func_void_void_ptr_ON__INT_PTR_ON__INT_PTR *resultCallback,void *a_context)

{
  bool bVar1;
  double local_58;
  undefined1 local_48 [8];
  ON_RTreePairSearchCallbackResult r;
  void *a_context_local;
  _func_void_void_ptr_ON__INT_PTR_ON__INT_PTR *resultCallback_local;
  double tolerance_local;
  ON_RTree *this_local;
  
  if (this->m_root == (ON_RTreeNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    r.m_resultCallback = (ON_RTreePairSearchCallback)a_context;
    bVar1 = ON_IsValid(tolerance);
    if ((!bVar1) || (local_58 = tolerance, tolerance <= 0.0)) {
      local_58 = 0.0;
    }
    local_48 = (undefined1  [8])local_58;
    r.m_tolerance = (double)r.m_resultCallback;
    r.m_context = resultCallback;
    SingleTreeSearchHelper(this->m_root,this->m_root,(ON_RTreePairSearchCallbackResult *)local_48);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::Search( 
  double tolerance,
  void ON_CALLBACK_CDECL resultCallback(void* a_context, ON__INT_PTR a_idA, ON__INT_PTR a_idB),
  void* a_context
  ) const
{
  if (0 == this->m_root)
    return false;
  ON_RTreePairSearchCallbackResult r;
  r.m_tolerance = (ON_IsValid(tolerance) && tolerance > 0.0) ? tolerance : 0.0;
  r.m_context = a_context;
  r.m_resultCallback = resultCallback;
  SingleTreeSearchHelper(this->m_root, this->m_root, &r);
  return true;
}